

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::APFloat::Storage::Storage(Storage *this,IEEEFloat *F,fltSemantics *Semantics)

{
  fltSemantics *S;
  APFloat AStack_78;
  undefined1 local_58 [32];
  IEEEFloat local_38;
  
  if (Semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,F);
    return;
  }
  S = F->semantics;
  detail::IEEEFloat::IEEEFloat(&local_38,F);
  APFloat((APFloat *)local_58,&local_38,S);
  detail::IEEEFloat::IEEEFloat(&AStack_78.U.IEEE,(fltSemantics *)semIEEEdouble);
  detail::DoubleAPFloat::DoubleAPFloat
            ((DoubleAPFloat *)this,(fltSemantics *)semPPCDoubleDouble,(APFloat *)local_58,&AStack_78
            );
  ~Storage((Storage *)&AStack_78.U.IEEE);
  ~Storage((Storage *)(local_58 + 8));
  detail::IEEEFloat::~IEEEFloat(&local_38);
  return;
}

Assistant:

APFloat::Storage::Storage(IEEEFloat F, const fltSemantics &Semantics) {
  if (usesLayout<IEEEFloat>(Semantics)) {
    new (&IEEE) IEEEFloat(std::move(F));
    return;
  }
  if (usesLayout<DoubleAPFloat>(Semantics)) {
    const auto& semantics = F.getSemantics();
    new (&Double)
        DoubleAPFloat(Semantics, APFloat(std::move(F), semantics),
                      APFloat(semIEEEdouble));
    return;
  }
  llvm_unreachable("Unexpected semantics");
}